

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.H
# Opt level: O2

Array<const_MultiFab_*,_3> * __thiscall
amrex::MLEBABecLap::getBCoeffs
          (Array<const_MultiFab_*,_3> *__return_storage_ptr__,MLEBABecLap *this,int amrlev,int mglev
          )

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)&(this->m_b_coeffs).
                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar2 = (long)mglev * 0x480;
  __return_storage_ptr__->_M_elems[0] = (MultiFab *)(lVar1 + lVar2);
  __return_storage_ptr__->_M_elems[1] = (MultiFab *)(lVar1 + lVar2 + 0x180);
  __return_storage_ptr__->_M_elems[2] = (MultiFab *)(lVar2 + lVar1 + 0x300);
  return __return_storage_ptr__;
}

Assistant:

virtual Array<MultiFab const*,AMREX_SPACEDIM> getBCoeffs (int amrlev, int mglev) const final override
        { return amrex::GetArrOfConstPtrs(m_b_coeffs[amrlev][mglev]); }